

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::print_typed_timesamples<int>
                   (string *__return_storage_ptr__,TypedTimeSamples<int> *v,uint32_t indent)

{
  ulong uVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference pvVar4;
  uint32_t n;
  string local_1f8;
  string local_1d8;
  ulong local_1b8;
  size_t i;
  vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
  *samples;
  stringstream ss;
  ostream aoStack_198 [380];
  uint32_t local_1c;
  TypedTimeSamples<int> *pTStack_18;
  uint32_t indent_local;
  TypedTimeSamples<int> *v_local;
  
  local_1c = indent;
  pTStack_18 = v;
  v_local = (TypedTimeSamples<int> *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&samples);
  std::operator<<(aoStack_198,"{\n");
  i = (size_t)TypedTimeSamples<int>::get_samples(pTStack_18);
  local_1b8 = 0;
  while( true ) {
    uVar1 = local_1b8;
    sVar2 = std::
            vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
            ::size((vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                    *)i);
    if (sVar2 <= uVar1) break;
    pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)(ulong)(local_1c + 1),n);
    poVar3 = std::operator<<(aoStack_198,(string *)&local_1d8);
    pvVar4 = std::
             vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
             ::operator[]((vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                           *)i,local_1b8);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar4->t);
    std::operator<<(poVar3,": ");
    std::__cxx11::string::~string((string *)&local_1d8);
    pvVar4 = std::
             vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
             ::operator[]((vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                           *)i,local_1b8);
    if ((pvVar4->blocked & 1U) == 0) {
      pvVar4 = std::
               vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
               ::operator[]((vector<tinyusdz::TypedTimeSamples<int>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<int>::Sample>_>
                             *)i,local_1b8);
      std::ostream::operator<<(aoStack_198,pvVar4->value);
    }
    else {
      std::operator<<(aoStack_198,"None");
    }
    std::operator<<(aoStack_198,",\n");
    local_1b8 = local_1b8 + 1;
  }
  pprint::Indent_abi_cxx11_(&local_1f8,(pprint *)(ulong)local_1c,n);
  poVar3 = std::operator<<(aoStack_198,(string *)&local_1f8);
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&samples);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_timesamples(const TypedTimeSamples<T> &v,
                                    const uint32_t indent = 0) {
  std::stringstream ss;

  ss << "{\n";

  const auto &samples = v.get_samples();

  for (size_t i = 0; i < samples.size(); i++) {
    ss << pprint::Indent(indent + 1) << samples[i].t << ": ";
    if (samples[i].blocked) {
      ss << "None";
    } else {
      ss << samples[i].value;
    }
    ss << ",\n";
  }

  ss << pprint::Indent(indent) << "}\n";

  return ss.str();
}